

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v4.cpp
# Opt level: O0

BOOL __thiscall
LASreadItemCompressed_BYTE14_v4::createAndInitModelsAndDecompressors
          (LASreadItemCompressed_BYTE14_v4 *this,U32 context,U8 *item)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ArithmeticModel **ppAVar3;
  ArithmeticModel *pAVar4;
  U8 *pUVar5;
  uint local_24;
  U32 i;
  U8 *item_local;
  U32 context_local;
  LASreadItemCompressed_BYTE14_v4 *this_local;
  
  if ((this->contexts[context].unused & 1U) != 0) {
    if (this->contexts[context].m_bytes == (ArithmeticModel **)0x0) {
      auVar1 = ZEXT416(this->number) * ZEXT816(8);
      uVar2 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      ppAVar3 = (ArithmeticModel **)operator_new__(uVar2);
      this->contexts[context].m_bytes = ppAVar3;
      for (local_24 = 0; local_24 < this->number; local_24 = local_24 + 1) {
        pAVar4 = ArithmeticDecoder::createSymbolModel(this->dec_Bytes[local_24],0x100);
        this->contexts[context].m_bytes[local_24] = pAVar4;
        ArithmeticDecoder::initSymbolModel
                  (this->dec_Bytes[local_24],this->contexts[context].m_bytes[local_24],(U32 *)0x0);
      }
      pUVar5 = (U8 *)operator_new__((ulong)this->number);
      this->contexts[context].last_item = pUVar5;
    }
    for (local_24 = 0; local_24 < this->number; local_24 = local_24 + 1) {
      ArithmeticDecoder::initSymbolModel
                (this->dec_Bytes[local_24],this->contexts[context].m_bytes[local_24],(U32 *)0x0);
    }
    memcpy(this->contexts[context].last_item,item,(ulong)this->number);
    this->contexts[context].unused = false;
    return true;
  }
  __assert_fail("contexts[context].unused",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/lasreaditemcompressed_v4.cpp"
                ,0x8a6,
                "BOOL LASreadItemCompressed_BYTE14_v4::createAndInitModelsAndDecompressors(U32, const U8 *)"
               );
}

Assistant:

inline BOOL LASreadItemCompressed_BYTE14_v4::createAndInitModelsAndDecompressors(U32 context, const U8* item)
{
  U32 i;

  /* should only be called when context is unused */

  assert(contexts[context].unused);

  /* first create all entropy models and last items (if needed) */

  if (contexts[context].m_bytes == 0)
  {
    contexts[context].m_bytes = new ArithmeticModel*[number];
    for (i = 0; i < number; i++)
    {
      contexts[context].m_bytes[i] = dec_Bytes[i]->createSymbolModel(256);
      dec_Bytes[i]->initSymbolModel(contexts[context].m_bytes[i]);
    }

    /* create last item */
    contexts[context].last_item = new U8[number];
  }

  /* then init entropy models */

  for (i = 0; i < number; i++)
  {
    dec_Bytes[i]->initSymbolModel(contexts[context].m_bytes[i]);
  }

  /* init current context from item */

  memcpy(contexts[context].last_item, item, number);

  contexts[context].unused = FALSE;

  return TRUE;
}